

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::InitEdge2(TEdge *e,PolyType Pt)

{
  TEdge *pTVar1;
  cInt cVar2;
  
  pTVar1 = e->Next;
  if ((e->Curr).Y < (pTVar1->Curr).Y) {
    cVar2 = (e->Curr).Y;
    (e->Top).X = (e->Curr).X;
    (e->Top).Y = cVar2;
    cVar2 = (pTVar1->Curr).Y;
    (e->Bot).X = (pTVar1->Curr).X;
    (e->Bot).Y = cVar2;
  }
  else {
    cVar2 = (e->Curr).Y;
    (e->Bot).X = (e->Curr).X;
    (e->Bot).Y = cVar2;
    cVar2 = (pTVar1->Curr).Y;
    (e->Top).X = (pTVar1->Curr).X;
    (e->Top).Y = cVar2;
  }
  SetDx(e);
  e->PolyTyp = Pt;
  return;
}

Assistant:

void InitEdge2(TEdge& e, PolyType Pt)
{
  if (e.Curr.Y >= e.Next->Curr.Y)
  {
    e.Bot = e.Curr;
    e.Top = e.Next->Curr;
  } else
  {
    e.Top = e.Curr;
    e.Bot = e.Next->Curr;
  }
  SetDx(e);
  e.PolyTyp = Pt;
}